

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

_Bool build_circular(chunk *c,loc_conflict centre,wchar_t rating)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  _Bool _Var4;
  _Bool _Var5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  void *p;
  ulong uVar12;
  loc_conflict lVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  wchar_t wVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  undefined8 in_R9;
  wchar_t wVar21;
  int iVar22;
  loc grid;
  loc lVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  bool bVar28;
  undefined1 in_stack_fffffffffffffee8;
  loc_conflict centre_local;
  ulong local_e0;
  ulong local_c0;
  loc_conflict offset;
  
  centre_local = centre;
  uVar6 = Rand_div(2);
  uVar7 = Rand_div(3);
  iVar24 = uVar7 + uVar6;
  wVar14 = c->depth;
  uVar8 = Rand_div(0x19);
  wVar21 = iVar24 * 2 + L'\x12';
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,wVar21,wVar21);
  if (((c->height <= centre_local.y) || (c->width <= centre_local.x)) &&
     (_Var4 = find_space(&centre_local,wVar21,wVar21), !_Var4)) {
    return false;
  }
  iVar9 = uVar7 + uVar6 + 4;
  iVar2 = centre_local.x;
  iVar3 = centre_local.y;
  iVar20 = iVar24 + 5;
  if (-1 < iVar20) {
    uVar18 = 0;
    iVar25 = iVar20;
    iVar22 = 0;
    do {
      wVar21 = (wchar_t)(wVar14 <= uVar8 + L'\x01');
      fill_xrange(c,iVar3 - iVar22,iVar2 - iVar25,iVar2 + iVar25,wVar21,(wchar_t)in_R9,
                  (_Bool)in_stack_fffffffffffffee8);
      fill_xrange(c,iVar22 + iVar3,iVar2 - iVar25,iVar2 + iVar25,wVar21,(wchar_t)in_R9,
                  (_Bool)in_stack_fffffffffffffee8);
      fill_yrange(c,iVar2 - iVar22,iVar3 - iVar25,iVar3 + iVar25,wVar21,(wchar_t)in_R9,
                  (_Bool)in_stack_fffffffffffffee8);
      fill_yrange(c,iVar22 + iVar2,iVar3 - iVar25,iVar3 + iVar25,wVar21,(wchar_t)in_R9,
                  (_Bool)in_stack_fffffffffffffee8);
      if (iVar22 < iVar20) {
        iVar10 = iVar25 * 2 + -1;
        iVar25 = iVar25 + 1;
        uVar19 = uVar18 + ~(iVar22 * 2);
        do {
          uVar18 = uVar19;
          uVar19 = iVar10 + uVar18;
          uVar11 = -uVar19;
          if (0 < (int)uVar19) {
            uVar11 = uVar19;
          }
          uVar1 = -uVar18;
          if (0 < (int)uVar18) {
            uVar1 = uVar18;
          }
          iVar10 = iVar10 + -2;
          iVar25 = iVar25 + -1;
        } while (uVar11 < uVar1);
        iVar25 = iVar25 - (uint)(uVar11 < uVar1);
      }
      bVar28 = iVar22 != iVar20;
      iVar22 = iVar22 + 1;
    } while (bVar28);
  }
  iVar20 = iVar3 - iVar9;
  uVar18 = iVar20 - 2;
  iVar25 = iVar24 + iVar3 + 6;
  if ((int)uVar18 <= iVar25) {
    uVar19 = (iVar2 - iVar9) - 2;
    iVar9 = iVar24 + iVar2 + 6;
    if ((int)uVar19 <= iVar9) {
      iVar22 = (iVar9 - uVar19) + 1;
      p = mem_zalloc((long)(((iVar25 - iVar20) + 3) * iVar22));
      if ((int)uVar18 < 1) {
        uVar18 = 0;
      }
      iVar20 = c->height + L'\xffffffff';
      if (iVar25 <= iVar20) {
        iVar20 = iVar25;
      }
      uVar11 = 0;
      if (0 < (int)uVar19) {
        uVar11 = uVar19;
      }
      iVar25 = c->width + L'\xffffffff';
      if (iVar9 <= iVar25) {
        iVar25 = iVar9;
      }
      if ((int)uVar18 <= iVar20) {
        local_e0 = (ulong)uVar18;
        local_c0 = local_e0;
        do {
          iVar10 = (int)local_c0;
          iVar9 = 1;
          if (1 < iVar10) {
            iVar9 = iVar10;
          }
          if ((int)uVar11 <= iVar25) {
            wVar15 = iVar9 + L'\xffffffff';
            wVar14 = c->height + L'\xffffffff';
            wVar21 = (wchar_t)(local_c0 + 1);
            if (wVar21 <= wVar14) {
              wVar14 = wVar21;
            }
            uVar27 = (ulong)uVar11;
            do {
              iVar26 = (int)uVar27;
              iVar9 = 1;
              if (1 < iVar26) {
                iVar9 = iVar26;
              }
              lVar23 = (loc)((local_c0 << 0x20) + uVar27);
              _Var4 = square_isfloor((chunk_conflict *)c,lVar23);
              if (_Var4) {
                wVar21 = c->width + L'\xffffffff';
                if (iVar26 + L'\x01' <= wVar21) {
                  wVar21 = iVar26 + L'\x01';
                }
                _Var4 = square_isroom((chunk_conflict *)c,lVar23);
                if (!_Var4) {
                  __assert_fail("square_isroom(c, grid)",
                                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                                ,0x1d5,
                                "void set_bordering_walls(struct chunk *, int, int, int, int)");
                }
                if (wVar14 - wVar15 == 2) {
                  wVar16 = iVar9 + L'\xffffffff';
                  if ((wVar21 - wVar16 == 2) && (wVar15 <= wVar14)) {
                    lVar23.y = wVar15;
                    lVar23.x = wVar16;
                    iVar9 = 0;
                    uVar12 = (ulong)(uint)wVar15;
                    do {
                      lVar17 = (ulong)(uint)wVar16 - 1;
                      grid = lVar23;
                      if (wVar16 <= wVar21) {
                        do {
                          _Var4 = square_isfloor((chunk_conflict *)c,grid);
                          _Var5 = square_isroom((chunk_conflict *)c,grid);
                          if (_Var4 != _Var5) {
                            __assert_fail("floor == square_isroom( c, adj)",
                                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                                          ,0x1ee,
                                          "void set_bordering_walls(struct chunk *, int, int, int, int)"
                                         );
                          }
                          iVar9 = iVar9 + (uint)_Var4;
                          lVar17 = lVar17 + 1;
                          grid = (loc)((long)grid + 1);
                        } while (lVar17 < wVar21);
                      }
                      lVar23 = (loc)((long)lVar23 + 0x100000000);
                      bVar28 = (long)uVar12 < (long)wVar14;
                      uVar12 = uVar12 + 1;
                    } while (bVar28);
                    if (iVar9 == 9) goto LAB_001515c2;
                  }
                }
                *(undefined1 *)
                 ((long)p + (long)(int)(((iVar10 - uVar18) * iVar22 - uVar11) + iVar26)) = 1;
              }
              else {
                _Var4 = square_isroom((chunk_conflict *)c,lVar23);
                if (_Var4) {
                  __assert_fail("!square_isroom(c, grid)",
                                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                                ,0x1ff,
                                "void set_bordering_walls(struct chunk *, int, int, int, int)");
                }
              }
LAB_001515c2:
              uVar27 = uVar27 + 1;
            } while (uVar27 != iVar25 + 1);
          }
          bVar28 = (long)local_c0 < (long)iVar20;
          local_c0 = local_c0 + 1;
        } while (bVar28);
        if ((int)uVar18 <= iVar20) {
          lVar17 = local_e0 << 0x20;
          iVar9 = 0;
          do {
            uVar27 = (ulong)uVar11;
            iVar10 = iVar9;
            if ((int)uVar11 <= iVar25) {
              do {
                if (*(char *)((long)p + (long)iVar10) == '\x01') {
                  lVar23 = (loc)(lVar17 + uVar27);
                  _Var4 = square_isfloor((chunk_conflict *)c,lVar23);
                  if ((!_Var4) || (_Var4 = square_isroom((chunk_conflict *)c,lVar23), !_Var4)) {
                    __assert_fail("square_isfloor(c, grid) && square_isroom(c, grid)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                                  ,0x209,
                                  "void set_bordering_walls(struct chunk *, int, int, int, int)");
                  }
                  square_set_feat((chunk_conflict *)c,lVar23,L'\x15');
                  generate_mark(c,(wchar_t)local_e0,(wchar_t)uVar27,(wchar_t)local_e0,
                                (wchar_t)uVar27,L'\f');
                }
                uVar27 = uVar27 + 1;
                iVar10 = iVar10 + 1;
              } while (iVar25 + 1 != uVar27);
            }
            lVar17 = lVar17 + 0x100000000;
            iVar9 = iVar9 + iVar22;
            bVar28 = (long)local_e0 < (long)iVar20;
            local_e0 = local_e0 + 1;
          } while (bVar28);
        }
      }
      mem_free(p);
      if (iVar24 < 1) {
        return true;
      }
      uVar6 = Rand_div(4);
      if (iVar24 <= (int)uVar6) {
        return true;
      }
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"middle chamber");
      rand_dir(&offset);
      draw_rectangle(c,iVar3 + L'\xfffffffe',iVar2 + L'\xfffffffe',iVar3 + L'\x02',iVar2 + L'\x02',
                     L'\x15',L'\v',false);
      lVar13 = loc(iVar2 + offset.x * 2,iVar3 + offset.y * 2);
      place_closed_door((chunk_conflict *)c,lVar13);
      wVar14 = c->depth;
      wVar21 = Rand_div(2);
      lVar13 = centre_local;
      vault_objects((chunk_conflict *)c,centre_local,wVar14,wVar21);
      wVar14 = c->depth;
      wVar21 = Rand_div(3);
      vault_monsters((chunk_conflict *)c,lVar13,wVar14 + L'\x01',wVar21);
      return true;
    }
  }
  __assert_fail("x2 >= x1 && y2 >= y1",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                ,0x1c2,"void set_bordering_walls(struct chunk *, int, int, int, int)");
}

Assistant:

bool build_circular(struct chunk *c, struct loc centre, int rating)
{
	/* Pick a room size */
	int radius = 2 + randint1(2) + randint1(3);

	/* Occasional light */
	bool light = c->depth <= randint1(25) ? true : false;

	/* Find and reserve lots of space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
		2 * radius + 10, 2 * radius + 10);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, 2 * radius + 10, 2 * radius + 10))
			return (false);
	}

	/* Mark as a room. */
	fill_circle(c, centre.y, centre.x, radius + 1, 0, FEAT_FLOOR,
		SQUARE_NONE, light);

	/* Convert some floors to be the outer walls. */
	set_bordering_walls(c, centre.y - radius - 2, centre.x - radius - 2,
		centre.y + radius + 2, centre.x + radius + 2);

	/* Especially large circular rooms will have a middle chamber */
	if (radius - 4 > 0 && randint0(4) < radius - 4) {
		struct loc offset;

		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"middle chamber");

		/* choose a random direction */
		rand_dir(&offset);

		/* draw a room with a closed door on a random side */
		draw_rectangle(c, centre.y - 2, centre.x - 2, centre.y + 2,
			centre.x + 2, FEAT_GRANITE, SQUARE_WALL_INNER, false);
		place_closed_door(c, loc(centre.x + offset.x * 2,
								 centre.y + offset.y * 2));

		/* Place a treasure in the vault */
		vault_objects(c, centre, c->depth, randint0(2));

		/* create some monsterss */
		vault_monsters(c, centre, c->depth + 1, randint0(3));
	}

	return true;
}